

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::forward(Buffer *this,off_t offset)

{
  long lVar1;
  char *__dest;
  long lVar2;
  
  if (offset < 0) {
    __assert_fail("offset >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                  ,0xa2,"void Liby::Buffer::forward(off_t)");
  }
  if (offset == 0) {
    lVar1 = this->leftIndex_;
    if (lVar1 != 0) {
      if (this->rightIndex_ < lVar1) {
        __assert_fail("rightIndex_ >= leftIndex_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                      ,0x5a,"off_t Liby::Buffer::size() const");
      }
      memmove(this->buffer_,this->buffer_ + lVar1,this->rightIndex_ - lVar1);
      this->rightIndex_ = this->rightIndex_ - this->leftIndex_;
      this->leftIndex_ = 0;
    }
  }
  else {
    lVar1 = this->rightIndex_;
    if (lVar1 - offset == 0 || lVar1 < offset) {
      this->leftIndex_ = 0;
      this->rightIndex_ = 0;
    }
    else {
      __dest = this->buffer_;
      lVar2 = this->leftIndex_;
      if (lVar2 < offset) {
        memmove(__dest,__dest + -offset + lVar1,lVar1 - offset);
        this->leftIndex_ = 0;
      }
      else {
        memmove(__dest + lVar2 + -offset,__dest + lVar2,lVar1 - lVar2);
        this->leftIndex_ = this->leftIndex_ - offset;
      }
      this->rightIndex_ = this->rightIndex_ - offset;
    }
  }
  return;
}

Assistant:

void Buffer::forward(off_t offset) {
    assert(offset >= 0);
    if (offset == 0) {
        if (leftIndex_ == 0) {
            return;
        }
        ::memmove(buffer_, buffer_ + leftIndex_, size());
        rightIndex_ -= leftIndex_;
        leftIndex_ = 0;
    } else if (offset >= rightIndex_) {
        leftIndex_ = rightIndex_ = 0;
    } else if (offset <= leftIndex_) {
        ::memmove(buffer_ + leftIndex_ - offset, buffer_ + leftIndex_,
                  rightIndex_ - leftIndex_);
        leftIndex_ -= offset;
        rightIndex_ -= offset;
    } else {
        ::memmove(buffer_, buffer_ + rightIndex_ - offset,
                  rightIndex_ - offset);
        leftIndex_ = 0;
        rightIndex_ -= offset;
    }
}